

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O2

Status __thiscall
leveldb::SetCurrentFile(leveldb *this,Env *env,string *dbname,uint64_t descriptor_number)

{
  pointer pcVar1;
  bool bVar2;
  string tmp;
  Slice contents;
  string manifest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  Status local_b8;
  Slice local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  Slice local_60;
  string local_50;
  
  DescriptorFileName(&local_50,dbname,descriptor_number);
  local_b0.data_ = local_50._M_dataplus._M_p;
  local_b0.size_ = local_50._M_string_length;
  std::operator+(&local_d8,dbname,"/");
  local_a0._M_dataplus._M_p = local_d8._M_dataplus._M_p;
  local_a0._M_string_length = local_d8._M_string_length;
  bVar2 = Slice::starts_with(&local_b0,(Slice *)&local_a0);
  if (!bVar2) {
    __assert_fail("contents.starts_with(dbname + \"/\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/filename.cc"
                  ,0x80,"Status leveldb::SetCurrentFile(Env *, const std::string &, uint64_t)");
  }
  std::__cxx11::string::_M_dispose();
  Slice::remove_prefix(&local_b0,dbname->_M_string_length + 1);
  TempFileName(&local_d8,dbname,descriptor_number);
  Slice::ToString_abi_cxx11_(&local_80,&local_b0);
  std::operator+(&local_a0,&local_80,"\n");
  local_60.data_ = local_a0._M_dataplus._M_p;
  local_60.size_ = local_a0._M_string_length;
  WriteStringToFileSync(this,env,&local_60,&local_d8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  if (*(long *)this == 0) {
    CurrentFileName(&local_a0,dbname);
    (*env->_vptr_Env[0xe])(&local_80,env,&local_d8,&local_a0);
    pcVar1 = *(pointer *)this;
    *(pointer *)this = local_80._M_dataplus._M_p;
    local_80._M_dataplus._M_p = pcVar1;
    Status::~Status((Status *)&local_80);
    std::__cxx11::string::_M_dispose();
    if (*(long *)this == 0) goto LAB_00117325;
  }
  (*env->_vptr_Env[8])(&local_b8,env,&local_d8);
  Status::~Status(&local_b8);
LAB_00117325:
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return (Status)(char *)this;
}

Assistant:

Status SetCurrentFile(Env* env, const std::string& dbname,
                      uint64_t descriptor_number) {
  // Remove leading "dbname/" and add newline to manifest file name
  std::string manifest = DescriptorFileName(dbname, descriptor_number);
  Slice contents = manifest;
  assert(contents.starts_with(dbname + "/"));
  contents.remove_prefix(dbname.size() + 1);
  std::string tmp = TempFileName(dbname, descriptor_number);
  Status s = WriteStringToFileSync(env, contents.ToString() + "\n", tmp);
  if (s.ok()) {
    s = env->RenameFile(tmp, CurrentFileName(dbname));
  }
  if (!s.ok()) {
    env->RemoveFile(tmp);
  }
  return s;
}